

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memarena.cpp
# Opt level: O0

Node * __thiscall
FSharedStringArena::FindString(FSharedStringArena *this,char *str,size_t strlen,uint *hash)

{
  DWORD DVar1;
  int iVar2;
  size_t sVar3;
  char *__s1;
  Node *local_38;
  Node *node;
  uint *hash_local;
  size_t strlen_local;
  char *str_local;
  FSharedStringArena *this_local;
  
  DVar1 = SuperFastHash(str,strlen);
  *hash = DVar1;
  local_38 = this->Buckets[(ulong)*hash & 0xff];
  do {
    if (local_38 == (Node *)0x0) {
      return (Node *)0x0;
    }
    if ((local_38->Hash == *hash) && (sVar3 = FString::Len(&local_38->String), sVar3 == strlen)) {
      __s1 = FString::operator[](&local_38->String,0);
      iVar2 = memcmp(__s1,str,strlen);
      if (iVar2 == 0) {
        return local_38;
      }
    }
    local_38 = local_38->Next;
  } while( true );
}

Assistant:

FSharedStringArena::Node *FSharedStringArena::FindString(const char *str, size_t strlen, unsigned int &hash)
{
	hash = SuperFastHash(str, strlen);

	for (Node *node = Buckets[hash % countof(Buckets)]; node != NULL; node = node->Next)
	{
		if (node->Hash == hash && node->String.Len() == strlen && memcmp(&node->String[0], str, strlen) == 0)
		{
			return node;
		}
	}
	return NULL;
}